

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O3

int Abc_NtkMakeLegit(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  uint uVar3;
  char *in_RSI;
  Abc_Obj_t *pNode;
  long lVar4;
  
  if (pNtk->ntkFunc == ABC_FUNC_SOP) {
    pVVar2 = pNtk->vObjs;
    if (0 < pVVar2->nSize) {
      lVar4 = 0;
      uVar3 = 0;
      do {
        pNode = (Abc_Obj_t *)pVVar2->pArray[lVar4];
        if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
          iVar1 = Abc_NodeMakeLegit(pNode);
          uVar3 = uVar3 + iVar1;
          pVVar2 = pNtk->vObjs;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < pVVar2->nSize);
      if (uVar3 != 0) {
        Abc_Print((int)pNode,in_RSI,(ulong)uVar3);
      }
    }
    return 1;
  }
  __assert_fail("Abc_NtkHasSop(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcFanOrder.c"
                ,0x1d1,"int Abc_NtkMakeLegit(Abc_Ntk_t *)");
}

Assistant:

int Abc_NtkMakeLegit( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i, Counter = 0;
    assert( Abc_NtkHasSop(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
        Counter += Abc_NodeMakeLegit( pNode );
    if ( Counter )
        Abc_Print( 0, "%d nodes were made dist1-cube-free and/or single-cube-containment-free.\n", Counter );
    return 1;
}